

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::IsKeyword
          (cmConditionEvaluator *this,static_string_view keyword,cmExpandedCommandArgument *argument
          )

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  cmListFileContext *context;
  ostream *poVar3;
  cmake *this_01;
  PolicyID id;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string local_1c0;
  ostringstream e;
  
  if ((this->Policy54Status < NEW) ||
     (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), !bVar1)) {
    psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    __x._M_str = (psVar2->_M_dataplus)._M_p;
    __x._M_len = psVar2->_M_string_length;
    bVar1 = std::operator==(__x,keyword.super_string_view);
    if (bVar1) {
      bVar1 = cmExpandedCommandArgument::WasQuoted(argument);
      if (!bVar1) {
        return true;
      }
      if (this->Policy54Status != WARN) {
        return true;
      }
      this_00 = this->Makefile;
      context = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                          (&(this->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
      bVar1 = cmMakefile::HasCMP0054AlreadyBeenReported(this_00,context);
      if (bVar1) {
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x36,id);
      poVar3 = std::operator<<((ostream *)&e,(string *)&local_1c0);
      poVar3 = std::operator<<(poVar3,"\nQuoted keywords like \"");
      psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
      poVar3 = std::operator<<(poVar3,(string *)psVar2);
      std::operator<<(poVar3,
                      "\" will no longer be interpreted as keywords when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                     );
      std::__cxx11::string::~string((string *)&local_1c0);
      this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_1c0,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmConditionEvaluator::IsKeyword(
  cm::static_string_view keyword,
  const cmExpandedCommandArgument& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return false;
  }

  const auto isKeyword = argument.GetValue() == keyword;

  if (isKeyword && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(this->Backtrace.Top())) {
      std::ostringstream e;
      // clang-format off
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0054)
        << "\n"
           "Quoted keywords like \"" << argument.GetValue() << "\" "
           "will no longer be interpreted as keywords "
           "when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";
      // clang-format on

      this->Makefile.GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return isKeyword;
}